

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestEnd
          (PrettyUnitTestResultPrinter *this,TestInfo *test_info)

{
  GTestColor color;
  bool bVar1;
  char *fmt;
  String SVar2;
  TimeInMillis local_30;
  String local_28;
  
  bVar1 = TestResult::Passed(&test_info->result_);
  if (bVar1) {
    fmt = "[       OK ] ";
    color = COLOR_GREEN;
  }
  else {
    fmt = "[  FAILED  ] ";
    color = COLOR_RED;
  }
  ColoredPrintf(color,fmt);
  PrintTestName((this->test_case_name_).c_str_,(test_info->name_)._M_dataplus._M_p);
  bVar1 = TestResult::Failed(&test_info->result_);
  if (bVar1) {
    PrintFullTestCommentIfPresent(test_info);
  }
  if (FLAGS_gtest_print_time == '\x01') {
    local_30 = (test_info->result_).elapsed_time_;
    SVar2 = StreamableToString<long_long>((internal *)&local_28,&local_30);
    printf(" (%s ms)\n",local_28.c_str_,SVar2.length_);
    String::~String(&local_28);
  }
  else {
    putchar(10);
  }
  fflush(_stdout);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestEnd(const TestInfo& test_info) {
  if (test_info.result()->Passed()) {
    ColoredPrintf(COLOR_GREEN, "[       OK ] ");
  } else {
    ColoredPrintf(COLOR_RED, "[  FAILED  ] ");
  }
  PrintTestName(test_case_name_.c_str(), test_info.name());
  if (test_info.result()->Failed())
    PrintFullTestCommentIfPresent(test_info);

  if (GTEST_FLAG(print_time)) {
    printf(" (%s ms)\n", internal::StreamableToString(
           test_info.result()->elapsed_time()).c_str());
  } else {
    printf("\n");
  }
  fflush(stdout);
}